

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_minimal_logger__on_delete(fct_logger_i *self_,fct_logger_evt_t *e)

{
  fct_minimal_logger_t *self;
  fct_logger_evt_t *e_local;
  fct_logger_i *self__local;
  
  fct_nlist__final((fct_nlist_t *)(self_ + 1),free);
  free(self_);
  return;
}

Assistant:

static void
fct_minimal_logger__on_delete(
    fct_logger_i *self_,
    fct_logger_evt_t const *e
)
{
    fct_minimal_logger_t *self = (fct_minimal_logger_t*)self_;
    fct_unused(e);
    fct_nlist__final(&(self->failed_cndtns_list), free);
    free(self);

}